

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void kj::_::stripLeadingAndTrailingSpace(ArrayPtr<const_char> *str)

{
  char *pcVar1;
  size_t sVar2;
  
  sVar2 = str->size_;
  if (sVar2 != 0) {
    pcVar1 = str->ptr;
    do {
      sVar2 = sVar2 - 1;
      if ((*pcVar1 != ' ') && (*pcVar1 != '\t')) break;
      str->ptr = pcVar1 + 1;
      str->size_ = sVar2;
      pcVar1 = pcVar1 + 1;
    } while (sVar2 != 0);
  }
  sVar2 = str->size_;
  if (sVar2 != 0) {
    do {
      sVar2 = sVar2 - 1;
      if ((str->ptr[sVar2] != ' ') && (str->ptr[sVar2] != '\t')) {
        return;
      }
      str->size_ = sVar2;
    } while (sVar2 != 0);
  }
  return;
}

Assistant:

void stripLeadingAndTrailingSpace(ArrayPtr<const char>& str) {
  // Remove any leading/trailing spaces from `str`, modifying it in-place.
  while (str.size() > 0 && (str[0] == ' ' || str[0] == '\t')) {
    str = str.slice(1, str.size());
  }
  while (str.size() > 0 && (str.back() == ' ' || str.back() == '\t')) {
    str = str.first(str.size() - 1);
  }
}